

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

void * asio::aligned_new(size_t align,size_t size)

{
  long lVar1;
  void *pvVar2;
  bad_alloc ex;
  
  if (align < 0x11) {
    align = 0x10;
  }
  lVar1 = align - size % align;
  if (size % align == 0) {
    lVar1 = 0;
  }
  pvVar2 = (void *)aligned_alloc(align,size + lVar1);
  if (pvVar2 == (void *)0x0) {
    _ex = std::ostream::operator<<;
    detail::throw_exception<std::bad_alloc>(&ex);
    std::bad_alloc::~bad_alloc(&ex);
  }
  return pvVar2;
}

Assistant:

inline void* aligned_new(std::size_t align, std::size_t size)
{
#if defined(ASIO_HAS_STD_ALIGNED_ALLOC)
  align = (align < ASIO_DEFAULT_ALIGN) ? ASIO_DEFAULT_ALIGN : align;
  size = (size % align == 0) ? size : size + (align - size % align);
  void* ptr = std::aligned_alloc(align, size);
  if (!ptr)
  {
    std::bad_alloc ex;
    asio::detail::throw_exception(ex);
  }
  return ptr;
#elif defined(ASIO_HAS_BOOST_ALIGN)
  align = (align < ASIO_DEFAULT_ALIGN) ? ASIO_DEFAULT_ALIGN : align;
  size = (size % align == 0) ? size : size + (align - size % align);
  void* ptr = boost::alignment::aligned_alloc(align, size);
  if (!ptr)
  {
    std::bad_alloc ex;
    asio::detail::throw_exception(ex);
  }
  return ptr;
#elif defined(ASIO_MSVC)
  align = (align < ASIO_DEFAULT_ALIGN) ? ASIO_DEFAULT_ALIGN : align;
  size = (size % align == 0) ? size : size + (align - size % align);
  void* ptr = _aligned_malloc(size, align);
  if (!ptr)
  {
    std::bad_alloc ex;
    asio::detail::throw_exception(ex);
  }
  return ptr;
#else // defined(ASIO_MSVC)
  (void)align;
  return ::operator new(size);
#endif // defined(ASIO_MSVC)
}